

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O1

int main(void)

{
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  bool bVar1;
  int iVar2;
  Reddit *this;
  logger *plVar3;
  Index *this_00;
  _Rb_tree_node_base *p_Var4;
  int *piVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string *container;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer this_01;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view delimiter;
  string_view_t fmt_01;
  string_view delimiter_00;
  string_view_t fmt_02;
  string_view_t fmt_03;
  string reply;
  set<Token,_std::less<Token>,_std::allocator<Token>_> tokens;
  set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> linkedTokens;
  vector<Comment,_std::allocator<Comment>_> comments;
  Linker linker;
  string local_2b8;
  string local_298;
  long local_270;
  undefined1 local_268 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  vector<Comment,_std::allocator<Comment>_> local_218;
  Comment *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 local_118 [24];
  seconds sStack_100;
  __uniq_ptr_impl<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_> local_f8;
  
  configureLogger();
  this = (Reddit *)operator_new(0x70);
  Reddit::Reddit(this);
  reddit = this;
  setupSignalHandler();
  loadData();
  plVar3 = spdlog::default_logger_raw();
  local_118._16_8_ = (pointer)0x0;
  sStack_100.__r = 0;
  local_f8._M_t.
  super__Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>.
  super__Head_base<0UL,_httplib::ClientImpl_*,_false>._M_head_impl =
       (tuple<httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>)
       (_Tuple_impl<0UL,_httplib::ClientImpl_*,_std::default_delete<httplib::ClientImpl>_>)0x0;
  spdlog::logger::log(plVar3,0.0);
  Linker::Linker((Linker *)(local_118 + 0x10));
  do {
    Reddit::requestNewComments(&local_218,reddit);
    local_200 = local_218.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
                super__Vector_impl_data._M_finish;
    this_01 = local_218.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_218.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_218.super__Vector_base<Comment,_std::allocator<Comment>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        paVar6 = &local_298.field_2;
        local_298._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct((ulong)&local_298,'(');
        plVar3 = spdlog::default_logger_raw();
        local_1f8 = 0;
        uStack_1f0 = 0;
        local_1e8 = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 7;
        fmt.data_ = "{}\n\n\n\n\n";
        spdlog::logger::log_<std::__cxx11::string>(plVar3,loc,info,fmt,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar6) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        Comment::toString_abi_cxx11_(&local_298,this_01);
        plVar3 = spdlog::default_logger_raw();
        local_268._0_8_ = (pointer)0x0;
        local_268._8_8_ = 0;
        local_268._16_8_ = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        fmt_00.size_ = 0xf;
        fmt_00.data_ = "new comment:\n{}";
        container = &local_298;
        spdlog::logger::log_<std::__cxx11::string>(plVar3,loc_00,info,fmt_00,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar6) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        this_00 = getIndex(&this_01->threadId);
        Index::addToIndex(this_00,this_01);
        lookForBotCommands(this_01);
        Comment::extractTokens
                  ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)&local_298,this_01);
        if (local_270 == 0) {
          plVar3 = spdlog::default_logger_raw();
          local_1d8 = 0;
          uStack_1d0 = 0;
          local_1c8 = 0;
          spdlog::logger::log(plVar3,0.0);
        }
        else {
          delimiter._M_str = (char *)&local_298;
          delimiter._M_len = (size_t)"\n";
          str::join<std::set<Token,std::less<Token>,std::allocator<Token>>>
                    ((string *)local_268,(str *)0x1,delimiter,
                     (set<Token,_std::less<Token>,_std::allocator<Token>_> *)container);
          plVar3 = spdlog::default_logger_raw();
          local_2b8._M_dataplus._M_p = (pointer)0x0;
          local_2b8._M_string_length = 0;
          local_2b8.field_2._M_allocated_capacity = 0;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
          loc_01.funcname = (char *)0x0;
          loc_01.filename = (char *)0x0;
          loc_01.line = 0;
          loc_01._12_4_ = 0;
          fmt_01.size_ = 0x15;
          fmt_01.data_ = "tokens in comment: {}";
          spdlog::logger::log_<std::__cxx11::string>(plVar3,loc_01,info,fmt_01,args);
          if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          Linker::getLinkedTokens
                    ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                     local_268,(Linker *)(local_118 + 0x10),
                     (set<Token,_std::less<Token>,_std::allocator<Token>_> *)&local_298);
          delimiter_00._M_str = (char *)local_268;
          delimiter_00._M_len = (size_t)"\n";
          str::join<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                    (&local_2b8,(str *)0x1,delimiter_00,
                     (set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)args)
          ;
          plVar3 = spdlog::default_logger_raw();
          local_1b8 = 0;
          uStack_1b0 = 0;
          local_1a8 = 0;
          loc_02.funcname = (char *)0x0;
          loc_02.filename = (char *)0x0;
          loc_02.line = 0;
          loc_02._12_4_ = 0;
          fmt_02.size_ = 0x11;
          fmt_02.data_ = "linked tokens: {}";
          spdlog::logger::log_<std::__cxx11::string>(plVar3,loc_02,info,fmt_02,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          bVar1 = allLinksKnownInThread
                            ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>
                              *)local_268,&this_01->threadId);
          if (bVar1) {
            plVar3 = spdlog::default_logger_raw();
            local_198 = 0;
            uStack_190 = 0;
            local_188 = 0;
            spdlog::logger::log(plVar3,0.0);
          }
          else {
            replyMessage_abi_cxx11_
                      (&local_2b8,
                       (set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                       local_268);
            plVar3 = spdlog::default_logger_raw();
            local_178 = 0;
            uStack_170 = 0;
            local_168 = 0;
            loc_03.funcname = (char *)0x0;
            loc_03.filename = (char *)0x0;
            loc_03.line = 0;
            loc_03._12_4_ = 0;
            fmt_03.size_ = 0x12;
            fmt_03.data_ = "Possible reply:\n{}";
            spdlog::logger::log_<std::__cxx11::string&>(plVar3,loc_03,info,fmt_03,&local_2b8);
            bVar1 = isReplyAllowed(this_01);
            if (bVar1) {
              local_238 = &local_228;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) {
                local_228._8_8_ = local_2b8.field_2._8_8_;
              }
              else {
                local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2b8._M_dataplus._M_p;
              }
              local_228._M_allocated_capacity = local_2b8.field_2._M_allocated_capacity;
              local_230 = local_2b8._M_string_length;
              local_2b8._M_string_length = 0;
              local_2b8.field_2._M_allocated_capacity =
                   local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              Reddit::comment((Reddit *)local_118,(string *)reddit,&this_01->fullName);
              nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)local_118);
              if (local_238 != &local_228) {
                operator_delete(local_238,local_228._M_allocated_capacity + 1);
              }
              plVar3 = spdlog::default_logger_raw();
              local_158 = 0;
              uStack_150 = 0;
              local_148 = 0;
              spdlog::logger::log(plVar3,0.0);
              if ((_Rb_tree_node_base *)local_268._24_8_ != (_Rb_tree_node_base *)(local_268 + 8)) {
                p_Var4 = (_Rb_tree_node_base *)local_268._24_8_;
                do {
                  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::push_back
                            (&this_00->links,(value_type *)(p_Var4 + 1));
                  std::
                  _Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>
                  ::_M_insert_unique<Token_const&>
                            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>
                              *)this_00,(Token *)(p_Var4 + 1));
                  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
                } while (p_Var4 != (_Rb_tree_node_base *)(local_268 + 8));
              }
            }
            else {
              plVar3 = spdlog::default_logger_raw();
              local_138 = 0;
              uStack_130 = 0;
              local_128 = 0;
              spdlog::logger::log(plVar3,0.0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::
          _Rb_tree<LinkedToken,_LinkedToken,_std::_Identity<LinkedToken>,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>
          ::~_Rb_tree((_Rb_tree<LinkedToken,_LinkedToken,_std::_Identity<LinkedToken>,_std::less<LinkedToken>,_std::allocator<LinkedToken>_>
                       *)local_268);
        }
        std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
        ::~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
                     *)&local_298);
        this_01 = this_01 + 1;
      } while (this_01 != local_200);
    }
    std::vector<Comment,_std::allocator<Comment>_>::~vector(&local_218);
    local_298._M_dataplus._M_p = (pointer)0x2;
    local_298._M_string_length = 0;
    do {
      iVar2 = nanosleep((timespec *)&local_298,(timespec *)&local_298);
      if (iVar2 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  } while( true );
}

Assistant:

int main() {
    configureLogger();
    reddit = new Reddit();

    setupSignalHandler();

    // debugComment("t1_jbj1if1");

    loadData();

    spdlog::info("Starting bot");

    Linker linker;
    while (true) {
        try {
            const std::vector<Comment> comments = reddit->requestNewComments();

            for (const Comment& comment : comments) {
                spdlog::info("{}\n\n\n\n\n", std::string(40, '-'));

                spdlog::info("new comment:\n{}", comment.toString());
                Index* index = getIndex(comment.threadId);

                index->addToIndex(comment);
                lookForBotCommands(comment);

                const std::set<Token> tokens = comment.extractTokens();
                if (tokens.size() == 0) {
                    spdlog::info("no tokens in comment");
                    continue;
                }

                spdlog::info("tokens in comment: {}", str::join("\n", tokens));

                const std::set<LinkedToken> linkedTokens = linker.getLinkedTokens(tokens);
                spdlog::info("linked tokens: {}", str::join("\n", linkedTokens));

                if (allLinksKnownInThread(linkedTokens, comment.threadId)) {
                    spdlog::info("No tokens to link");
                    continue;
                }

                std::string reply = replyMessage(linkedTokens);
                spdlog::info("Possible reply:\n{}", reply);

                if (isReplyAllowed(comment)) {
                    reddit->comment(comment.fullName, std::move(reply));
                    spdlog::info("Reply sent");

                    for (const LinkedToken& t : linkedTokens) {
                        index->addToIndex(t);
                    }
                } else {
                    spdlog::info("Reply canceled");
                }
            }
        } catch (std::exception& e) {
            spdlog::error("{}\n", e.what());
        } catch (...) {
            spdlog::critical("Catched unknown error!\n");
        }
        std::this_thread::sleep_for(std::chrono::seconds(2));
    }
}